

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O0

bool __thiscall HighsHessian::operator==(HighsHessian *this,HighsHessian *hessian)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  bool equal;
  bool local_21;
  
  iVar2 = *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  iVar1 = *in_RSI;
  local_21 = std::operator==((vector<int,_std::allocator<int>_> *)unaff_retaddr,
                             (vector<int,_std::allocator<int>_> *)in_RDI);
  local_21 = local_21 && iVar2 == iVar1;
  bVar3 = std::operator==((vector<int,_std::allocator<int>_> *)unaff_retaddr,
                          (vector<int,_std::allocator<int>_> *)in_RDI);
  if (!bVar3) {
    local_21 = false;
  }
  bVar3 = std::operator==(unaff_retaddr,in_RDI);
  if (!bVar3) {
    local_21 = false;
  }
  return local_21;
}

Assistant:

bool HighsHessian::operator==(const HighsHessian& hessian) const {
  bool equal = true;
  equal = this->dim_ == hessian.dim_ && equal;
  equal = this->start_ == hessian.start_ && equal;
  equal = this->index_ == hessian.index_ && equal;
  equal = this->value_ == hessian.value_ && equal;
  return equal;
}